

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O0

void __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder>::
CheckAndStoreTopologySplitEvent
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder> *this,
          int src_symbol_id,int param_3,EdgeFaceName src_edge,int neighbor_face_id)

{
  int iVar1;
  undefined1 in_CL;
  undefined4 in_ESI;
  undefined4 in_R8D;
  TopologySplitEventData event_data;
  int symbol_id;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  undefined3 in_stack_ffffffffffffffec;
  undefined4 uVar2;
  
  uVar2 = CONCAT13(in_CL,in_stack_ffffffffffffffec);
  iVar1 = GetSplitSymbolIdOnFace
                    ((MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder> *)
                     CONCAT44(uVar2,in_R8D),in_stack_ffffffffffffffe4);
  if (iVar1 != -1) {
    std::vector<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>::
    push_back((vector<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
               *)CONCAT44(iVar1,CONCAT31((int3)((uint)in_stack_ffffffffffffffe0 >> 8),
                                         (byte)in_stack_ffffffffffffffe0 & 0xfe |
                                         (byte)((uint)uVar2 >> 0x18) & 1)),
              (value_type *)CONCAT44(in_ESI,iVar1));
  }
  return;
}

Assistant:

void MeshEdgebreakerEncoderImpl<
    TraversalEncoder>::CheckAndStoreTopologySplitEvent(int src_symbol_id,
                                                       int /* src_face_id */,
                                                       EdgeFaceName src_edge,
                                                       int neighbor_face_id) {
  const int symbol_id = GetSplitSymbolIdOnFace(neighbor_face_id);
  if (symbol_id == -1) {
    return;  // Not a split symbol, no topology split event could happen.
  }
  TopologySplitEventData event_data;

  event_data.split_symbol_id = symbol_id;
  event_data.source_symbol_id = src_symbol_id;
  event_data.source_edge = src_edge;
  topology_split_event_data_.push_back(event_data);
}